

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::ZoneHeap::_releaseDynamic(ZoneHeap *this,void *p,size_t size)

{
  DynamicBlock *__ptr;
  DynamicBlock *pDVar1;
  DynamicBlock *pDVar2;
  DynamicBlock **ppDVar3;
  
  if (this->_zone == (Zone *)0x0) {
    _releaseDynamic();
  }
  else {
    __ptr = *(DynamicBlock **)((long)p + -8);
    ppDVar3 = &this->_dynamicBlocks;
    do {
      pDVar1 = *ppDVar3;
      if (pDVar1 == __ptr) break;
      ppDVar3 = &pDVar1->next;
    } while (pDVar1 != (DynamicBlock *)0x0);
    if (pDVar1 != (DynamicBlock *)0x0) {
      pDVar1 = __ptr->prev;
      pDVar2 = __ptr->next;
      ppDVar3 = &pDVar1->next;
      if (pDVar1 == (DynamicBlock *)0x0) {
        ppDVar3 = &this->_dynamicBlocks;
      }
      *ppDVar3 = pDVar2;
      if (pDVar2 != (DynamicBlock *)0x0) {
        pDVar2->prev = pDVar1;
      }
      free(__ptr);
      return;
    }
  }
  _releaseDynamic();
}

Assistant:

void ZoneHeap::_releaseDynamic(void* p, size_t size) noexcept {
  ASMJIT_ASSERT(isInitialized());
  //printf("RELEASING DYNAMIC %p of size %d\n", p, int(size));

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneHeap_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  Internal::releaseMemory(block);
}